

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepResize(void *arkode_mem,N_Vector y0,realtype t0,ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *in_RCX;
  long in_RSI;
  int retval;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  SUNNonlinearSolver NLS;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  sunindextype in_stack_ffffffffffffff94;
  N_Vector in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  sunindextype liw_diff_00;
  sunindextype lrw_diff_00;
  SUNNonlinearSolver in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  sunindextype in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffff98,
                       (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (ARKodeMem *)in_stack_ffffffffffffff88,(ARKodeMRIStepMem *)0xeb7cb9);
  if (local_4 == 0) {
    liw_diff_00 = 0;
    lrw_diff_00 = 0;
    if (*(long *)(*(long *)(in_RSI + 8) + 0x20) != 0) {
      N_VSpace((N_Vector)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (sunindextype *)in_stack_ffffffffffffff88,(sunindextype *)0xeb7d05);
    }
    iVar1 = lrw_diff_00 -
            *(int *)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x210);
    iVar2 = liw_diff_00 -
            *(int *)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x214);
    *(sunindextype *)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x210) =
         lrw_diff_00;
    *(sunindextype *)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x214) =
         liw_diff_00;
    local_4 = arkResize((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        in_stack_ffffffffffffffc0,(realtype)in_stack_ffffffffffffffb8,
                        (realtype)CONCAT44(lrw_diff_00,liw_diff_00),
                        (ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                        (void *)CONCAT44(local_4,in_stack_ffffffffffffffa0));
    if (local_4 == 0) {
      iVar4 = iVar2;
      if (in_stack_ffffffffffffffc0[1].sunctx != (SUNContext)0x0) {
        in_stack_ffffffffffffff88 =
             (N_Vector)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x218);
        in_stack_ffffffffffffff98 =
             (N_Vector)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x220);
        iVar3 = arkResizeVecArray((ARKVecResizeFn)CONCAT44(iVar1,iVar2),
                                  (void *)(ulong)in_stack_ffffffffffffffa0,
                                  (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                  (N_Vector)CONCAT44(in_stack_ffffffffffffff94,iVar2),
                                  (N_Vector **)in_stack_ffffffffffffff88,0,
                                  (long *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_RCX
                                 );
        in_stack_ffffffffffffff90 = iVar2;
        if (iVar3 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize","Unable to resize vector");
          return -0x14;
        }
      }
      iVar2 = iVar4;
      if (in_stack_ffffffffffffffc0[2].content != (void *)0x0) {
        in_stack_ffffffffffffff88 =
             (N_Vector)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x218);
        in_stack_ffffffffffffff98 =
             (N_Vector)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x220);
        iVar3 = arkResizeVecArray((ARKVecResizeFn)CONCAT44(iVar1,iVar4),
                                  (void *)CONCAT44(local_4,in_stack_ffffffffffffffa0),
                                  (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                  (N_Vector)CONCAT44(in_stack_ffffffffffffff94,iVar4),
                                  (N_Vector **)in_stack_ffffffffffffff88,0,
                                  (long *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_RCX
                                 );
        in_stack_ffffffffffffff90 = iVar4;
        if (iVar3 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize","Unable to resize vector");
          return -0x14;
        }
      }
      if (in_stack_ffffffffffffffc0[4].sunctx != (SUNContext)0x0) {
        in_stack_ffffffffffffff88 = (N_Vector)&in_stack_ffffffffffffffc0[4].sunctx;
        iVar4 = arkResizeVec((ARKodeMem)CONCAT44(iVar1,iVar2),
                             (ARKVecResizeFn)CONCAT44(local_4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             (N_Vector *)in_stack_ffffffffffffffc0);
        if (iVar4 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize","Unable to resize vector");
          return -0x14;
        }
      }
      if (in_stack_ffffffffffffffc0[5].content != (void *)0x0) {
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffffc0 + 5;
        iVar4 = arkResizeVec((ARKodeMem)CONCAT44(iVar1,iVar2),
                             (ARKVecResizeFn)CONCAT44(local_4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             (N_Vector *)in_stack_ffffffffffffffc0);
        if (iVar4 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize","Unable to resize vector");
          return -0x14;
        }
      }
      if (in_stack_ffffffffffffffc0[5].ops != (N_Vector_Ops)0x0) {
        in_stack_ffffffffffffff88 = (N_Vector)&in_stack_ffffffffffffffc0[5].ops;
        iVar4 = arkResizeVec((ARKodeMem)CONCAT44(iVar1,iVar2),
                             (ARKVecResizeFn)CONCAT44(local_4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             (N_Vector *)in_stack_ffffffffffffffc0);
        if (iVar4 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize","Unable to resize vector");
          return -0x14;
        }
      }
      if ((in_stack_ffffffffffffffc0[6].content != (void *)0x0) &&
         (*(int *)&in_stack_ffffffffffffffc0[6].ops != 0)) {
        iVar4 = SUNNonlinSolFree((SUNNonlinearSolver)in_stack_ffffffffffffff88);
        if (iVar4 != 0) {
          return iVar4;
        }
        in_stack_ffffffffffffffc0[6].content = (void *)0x0;
        *(undefined4 *)&in_stack_ffffffffffffffc0[6].ops = 0;
        in_stack_ffffffffffffffb8 =
             SUNNonlinSol_Newton(in_stack_ffffffffffffff98,
                                 (SUNContext)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (in_stack_ffffffffffffffb8 == (SUNNonlinearSolver)0x0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize",
                          "Error creating default Newton solver");
          return -0x14;
        }
        iVar4 = MRIStepSetNonlinearSolver
                          ((void *)CONCAT44(iVar1,iVar2),
                           (SUNNonlinearSolver)CONCAT44(iVar4,in_stack_ffffffffffffffa0));
        if (iVar4 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          -0x14,"ARKode::MRIStep","MRIStepResize",
                          "Error attaching default Newton solver");
          return -0x14;
        }
        *(undefined4 *)&in_stack_ffffffffffffffc0[6].ops = 1;
      }
      iVar1 = mriStepInnerStepper_Resize
                        ((MRIStepInnerStepper)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (ARKVecResizeFn)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         lrw_diff_00,liw_diff_00,(N_Vector)CONCAT44(iVar1,iVar2));
      if (iVar1 == 0) {
        if (in_stack_ffffffffffffffc0[6].content != (void *)0x0) {
          in_stack_ffffffffffffffc0[0xf].sunctx = (SUNContext)0x0;
        }
        local_4 = 0;
      }
      else {
        arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        -0x14,"ARKode::MRIStep","MRIStepResize","Unable to resize vector");
        local_4 = 0xffffffec;
      }
    }
    else {
      arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (int)(ulong)local_4,"ARKode::MRIStep","MRIStepResize",
                      "Unable to resize main ARKode infrastructure");
    }
  }
  return local_4;
}

Assistant:

int MRIStepResize(void *arkode_mem, N_Vector y0, realtype t0,
                  ARKVecResizeFn resize, void *resize_data)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepResize",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* resize ARKode infrastructure memory (use hscale = 1.0) */
  retval = arkResize(ark_mem, y0, RCONST(1.0), t0, resize, resize_data);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepResize",
                    "Unable to resize main ARKode infrastructure");
    return(retval);
  }

  /* Resize Fse */
  if (step_mem->Fse) {
    if (!arkResizeVecArray(resize, resize_data,
                           step_mem->nstages_stored, y0, &(step_mem->Fse),
                           lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  }

  /* Resize Fsi */
  if (step_mem->Fsi) {
    if (!arkResizeVecArray(resize, resize_data,
                           step_mem->nstages_stored, y0, &(step_mem->Fsi),
                           lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  }

  /* Resize the nonlinear solver interface vectors (if applicable) */
  if (step_mem->sdata != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->sdata)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  if (step_mem->zpred != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->zpred)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }
  if (step_mem->zcor != NULL)
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, y0, &step_mem->zcor)) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Unable to resize vector");
      return(ARK_MEM_FAIL);
    }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {

    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS)  return(retval);
    step_mem->NLS = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Error creating default Newton solver");
      return(ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object to MRIStep */
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepResize", "Error attaching default Newton solver");
      return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;

  }

  /* Resize the inner stepper vectors */
  retval = mriStepInnerStepper_Resize(step_mem->stepper, resize, resize_data,
                                      lrw_diff, liw_diff, y0);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepResize", "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL)  step_mem->nsetups = 0;

  return(ARK_SUCCESS);
}